

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O2

void removeFile(string *path)

{
  long lVar1;
  int iVar2;
  char *__s2;
  inode *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  undefined1 *puVar11;
  ulong uVar12;
  int *piVar13;
  string local_d38;
  char *local_d18;
  long local_d10;
  char *local_cf8;
  long local_cf0;
  char *local_cd8;
  long local_cd0;
  undefined8 auStack_cc8 [2];
  string names [100];
  
  lVar8 = 0x10;
  do {
    puVar11 = (undefined1 *)((long)&names[0]._M_dataplus._M_p + lVar8);
    *(undefined1 **)((long)auStack_cc8 + lVar8) = puVar11;
    *(undefined8 *)((long)auStack_cc8 + lVar8 + 8) = 0;
    *puVar11 = 0;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0xc90);
  std::__cxx11::string::string((string *)&local_d38,(string *)path);
  iVar4 = parsePath(&local_d38,names);
  std::__cxx11::string::~string((string *)&local_d38);
  std::__cxx11::string::string((string *)&local_cd8,(string *)path);
  iVar5 = doesExist(names,iVar4,local_cd0 == 0 || *local_cd8 != '/');
  std::__cxx11::string::~string((string *)&local_cd8);
  if (iVar5 == iVar4) {
    std::__cxx11::string::string((string *)&local_cf8,(string *)path);
    iVar6 = getId(names,iVar4,local_cf0 == 0 || *local_cf8 != '/');
    std::__cxx11::string::~string((string *)&local_cf8);
    super_block.inode_bitmap[iVar6] = false;
    iVar5 = inodes[iVar6].i_file_size;
    iVar2 = inodes[iVar6].i_blocks[0];
    super_block.block_bitmap[iVar2] = false;
    memset(emptyspaces + (long)iVar2 * 0x1000,0,0x1000);
    inodes[iVar6].i_id = 0;
    inodes[iVar6].i_mode = 0;
    inodes[iVar6].i_file_size = 0;
    inodes[iVar6].i_blocks[0] = 0;
    piVar3 = inodes + iVar6;
    piVar3->i_place_holder[0] = '\0';
    piVar3->i_place_holder[1] = '\0';
    piVar3->i_place_holder[2] = '\0';
    piVar3->i_place_holder[3] = '\0';
    piVar3->i_place_holder[4] = '\0';
    piVar3->i_place_holder[5] = '\0';
    piVar3->i_place_holder[6] = '\0';
    piVar3->i_place_holder[7] = '\0';
    piVar3 = inodes + iVar6;
    piVar3->i_place_holder[8] = '\0';
    piVar3->i_place_holder[9] = '\0';
    piVar3->i_place_holder[10] = '\0';
    piVar3->i_place_holder[0xb] = '\0';
    piVar3->i_place_holder[0xc] = '\0';
    piVar3->i_place_holder[0xd] = '\0';
    piVar3->i_place_holder[0xe] = '\0';
    piVar3->i_place_holder[0xf] = '\0';
    std::__cxx11::string::string((string *)&local_d18,(string *)path);
    uVar7 = getId(names,iVar4 + -1,local_d10 == 0 || *local_d18 != '/');
    uVar12 = (ulong)uVar7;
    std::__cxx11::string::~string((string *)&local_d18);
    lVar9 = (long)(int)uVar7 * 0x20;
    iVar2 = inodes[(int)uVar7].i_blocks[0];
    __s2 = names[(long)iVar4 + -1]._M_dataplus._M_p;
    lVar8 = 0;
    do {
      lVar1 = lVar8 + 0x100;
      if (lVar1 == 0x1100) goto LAB_00103d2e;
      iVar4 = strcmp(emptyspaces + lVar8 + (long)iVar2 * 0x1000,__s2);
      lVar8 = lVar1;
    } while (iVar4 != 0);
    memset(emptyspaces + lVar1 + (long)iVar2 * 0x1000 + -0x100,0,0x100);
LAB_00103d2e:
    while( true ) {
      piVar13 = (int *)((long)inodes[0].i_blocks + lVar9 + -4);
      *piVar13 = *piVar13 - iVar5;
      if ((int)uVar12 == 0) break;
      uVar12 = (ulong)*(int *)(emptyspaces + (long)inodes[(int)uVar12].i_blocks[0] * 0x1000 + 0x1fc)
      ;
      lVar9 = uVar12 << 5;
    }
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,(string *)path);
    std::operator<<(poVar10,": No such file or directory.\n");
  }
  lVar8 = 0xc60;
  do {
    std::__cxx11::string::~string((string *)((long)&names[0]._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  return;
}

Assistant:

void removeFile(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);//找到该路径在inode中的i.id
        int size = inodes[id].i_file_size;
        File_Block *p = getAddressByLocation_File(inodes[id].i_blocks[0]);
        inode *q = &inodes[id];
        super_block.inode_bitmap[id] = 0;
        super_block.block_bitmap[inodes[id].i_blocks[0]] = 0;
        memset(p, '\0', sizeof(File_Block));
        memset(q, '\0', sizeof(inode));
        int parentid = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//找到母文件夹
        dir_block *parent = getAddressByLocation_Folder(inodes[parentid].i_blocks[0]);
        for (int i = 0; i < 16; i++) {
            if (strcmp(parent->dirs[i].name, names[layers - 1].c_str()) == 0) {
                dir_entry *temp = &parent->dirs[i];
                memset(temp, '\0', sizeof(dir_entry));
                break;
            }
        }
        inodes[parentid].i_file_size -= size;
        while(parentid != 0){
            parentid = getParentById(parentid);
            inodes[parentid].i_file_size -= size;
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << path << ": No such file or directory.\n";
        setColor(COLOR_ORIGIN);
    }
}